

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O2

pointer __thiscall
jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
create_array<jsoncons::json_array<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector>>
          (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *this,allocator_type *alloc
          ,json_array<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
           *args)

{
  pointer pbVar1;
  pointer_conflict pjVar2;
  stor_allocator_type stor_alloc;
  
  pjVar2 = std::
           allocator_traits<std::allocator<jsoncons::json_array<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>_>_>
           ::allocate(&stor_alloc,1);
  pbVar1 = (args->elements_).
           super__Vector_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (pjVar2->elements_).
  super__Vector_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (args->elements_).
       super__Vector_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (pjVar2->elements_).
  super__Vector_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar1;
  (pjVar2->elements_).
  super__Vector_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (args->elements_).
       super__Vector_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (args->elements_).
  super__Vector_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (args->elements_).
  super__Vector_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (args->elements_).
  super__Vector_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return pjVar2;
}

Assistant:

typename array_storage::pointer create_array(const allocator_type& alloc, Args&& ... args)
        {
            using stor_allocator_type = typename array_storage::allocator_type;
            stor_allocator_type stor_alloc(alloc);
            auto ptr = std::allocator_traits<stor_allocator_type>::allocate(stor_alloc, 1);
            JSONCONS_TRY
            {
                std::allocator_traits<stor_allocator_type>::construct(stor_alloc, ext_traits::to_plain_pointer(ptr), 
                    std::forward<Args>(args)...);
            }